

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O1

ON_ComponentStatus * BrepComponentStatus(ON_Brep *brep,ON_COMPONENT_INDEX component_index)

{
  ON_BrepTrim *pOVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  
  if ((-1 < (long)component_index) && (component_index.m_type - brep_vertex < 5)) {
    uVar4 = (ulong)component_index >> 0x20;
    iVar3 = component_index.m_index;
    switch(component_index.m_type) {
    case brep_vertex:
      if (iVar3 < (brep->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
                  .m_count) {
        return &(brep->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
                m_a[uVar4].m_status;
      }
      break;
    case brep_edge:
      if (iVar3 < (brep->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
                  m_count) {
        pOVar1 = (ON_BrepTrim *)
                 (brep->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
        lVar2 = uVar4 * 0x88;
LAB_0055c9f5:
        return (ON_ComponentStatus *)((long)pOVar1->m_vi + lVar2 + -0x10);
      }
      break;
    case brep_face:
      if (iVar3 < (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                  m_count) {
        return &(brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a
                [uVar4].m_status;
      }
      break;
    case brep_trim:
      if (iVar3 < (brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                  m_count) {
        pOVar1 = (brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
        lVar2 = uVar4 * 0xe8;
        goto LAB_0055c9f5;
      }
      break;
    case brep_loop:
      if (iVar3 < (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                  m_count) {
        return &(brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a
                [uVar4].m_status;
      }
    }
  }
  return (ON_ComponentStatus *)0x0;
}

Assistant:

static ON_ComponentStatus* BrepComponentStatus(
  const ON_Brep& brep,
  ON_COMPONENT_INDEX component_index
  )
{
  if (component_index.m_index >= 0)
  {
    switch (component_index.m_type)
    {
    case ON_COMPONENT_INDEX::TYPE::brep_vertex:
      if ( component_index.m_index < brep.m_V.Count() )
        return &brep.m_V[component_index.m_index].m_status;
      break;
    case ON_COMPONENT_INDEX::TYPE::brep_edge:
      if ( component_index.m_index < brep.m_E.Count() )
        return &brep.m_E[component_index.m_index].m_status;
      break;
    case ON_COMPONENT_INDEX::TYPE::brep_trim:
      if ( component_index.m_index < brep.m_T.Count() )
        return &brep.m_T[component_index.m_index].m_status;
      break;
    case ON_COMPONENT_INDEX::TYPE::brep_loop:
      if ( component_index.m_index < brep.m_L.Count() )
        return &brep.m_L[component_index.m_index].m_status;
      break;
    case ON_COMPONENT_INDEX::TYPE::brep_face:
      if ( component_index.m_index < brep.m_F.Count() )
        return &brep.m_F[component_index.m_index].m_status;
      break;
    default:
      break;
    }
  }
  return nullptr;
}